

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::_update_activation(Group *this,GroupState *state,View *view)

{
  Controller *pCVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  Controller *local_38;
  Controller *local_30;
  undefined1 local_22;
  byte local_21;
  bool view_is_active;
  View *pVStack_20;
  bool view_was_active;
  View *view_local;
  GroupState *state_local;
  Group *this_local;
  
  pVStack_20 = view;
  view_local = (View *)state;
  state_local = (GroupState *)this;
  fVar2 = View::get_act(view);
  fVar3 = get_act_thr(this);
  local_21 = fVar3 < fVar2;
  dVar4 = update_act(this,pVStack_20);
  fVar2 = get_act_thr(this);
  local_22 = (double)fVar2 < dVar4;
  if ((((view_local->super_View).super__Object.refCount.super___atomic_base<long>._M_i & 1) == 0) ||
     (((view_local->super_View).super__Object.refCount.super___atomic_base<long>._M_i & 0x10000) ==
      0)) {
    if ((((view_local->super_View).super__Object.refCount.super___atomic_base<long>._M_i & 0x100) !=
         0) && ((((view_local->super_View).super__Object.refCount.super___atomic_base<long>._M_i &
                 0x1000000) != 0 && ((bool)local_22)))) {
      pCVar1 = core::P<r_exec::Controller>::operator->(&pVStack_20->controller);
      (*(pCVar1->super__Object)._vptr__Object[5])();
      local_38 = core::P::operator_cast_to_Controller_((P *)&pVStack_20->controller);
      std::vector<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>::push_back
                (&this->new_controllers,&local_38);
    }
  }
  else if ((((view_local->super_View).super__Object.refCount.super___atomic_base<long>._M_i & 0x100)
            == 0) ||
          (((view_local->super_View).super__Object.refCount.super___atomic_base<long>._M_i &
           0x1000000) == 0)) {
    pCVar1 = core::P<r_exec::Controller>::operator->(&pVStack_20->controller);
    (*(pCVar1->super__Object)._vptr__Object[6])();
  }
  else if ((local_21 & 1) == 0) {
    if ((bool)local_22) {
      pCVar1 = core::P<r_exec::Controller>::operator->(&pVStack_20->controller);
      (*(pCVar1->super__Object)._vptr__Object[5])();
      local_30 = core::P::operator_cast_to_Controller_((P *)&pVStack_20->controller);
      std::vector<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>::push_back
                (&this->new_controllers,&local_30);
    }
  }
  else if (!(bool)local_22) {
    pCVar1 = core::P<r_exec::Controller>::operator->(&pVStack_20->controller);
    (*(pCVar1->super__Object)._vptr__Object[6])();
  }
  return;
}

Assistant:

void Group::_update_activation(GroupState *state, View *view)
{
    bool view_was_active = view->get_act() > get_act_thr();
    bool view_is_active = update_act(view) > get_act_thr();

    // kill newly inactive controllers, register newly active ones.
    if (state->was_c_active && state->was_c_salient) {
        if (!state->is_c_active || !state->is_c_salient) { // group is not c-active and c-salient anymore: kill the view's controller.
            view->controller->lose_activation();
        } else { // group remains c-active and c-salient.
            if (!view_was_active) {
                if (view_is_active) { // register the controller for the newly active ipgm view.
                    view->controller->gain_activation();
                    new_controllers.push_back(view->controller);
                }
            } else {
                if (!view_is_active) { // kill the newly inactive ipgm view's overlays.
                    view->controller->lose_activation();
                }
            }
        }
    } else if (state->is_c_active && state->is_c_salient) { // group becomes c-active and c-salient.
        if (view_is_active) { // register the controller for any active ipgm view.
            view->controller->gain_activation();
            new_controllers.push_back(view->controller);
        }
    }
}